

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O0

void testYca(string *tempDir)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  void *this;
  exception *e;
  int readOrder;
  int writeOrder;
  int i;
  int n;
  int maxThreads;
  Box2i dataWindow [6];
  string fileName;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffd88;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffd90;
  Vec2<int> *in_stack_fffffffffffffd98;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  string *local_188;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  Vec2<int> local_158;
  Vec2<int> local_150 [3];
  Vec2<int> local_138;
  Vec2<int> local_130 [3];
  Vec2<int> local_118;
  Vec2<int> local_110 [3];
  Vec2<int> local_f8;
  Vec2<int> local_f0 [3];
  Vec2<int> local_d8;
  Vec2<int> local_d0 [3];
  Vec2<int> local_b8;
  Vec2<int> local_b0 [3];
  string local_98 [40];
  _func_void_Array2D<Imf_3_4::Rgba>_ptr_int_int *in_stack_ffffffffffffff90;
  LineOrder in_stack_ffffffffffffff9c;
  LineOrder in_stack_ffffffffffffffa0;
  RgbaChannels in_stack_ffffffffffffffa4;
  Box2i *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  string local_38 [56];
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing luminance/chroma input and output");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                 in_stack_fffffffffffffdb0);
  local_188 = local_98;
  do {
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_fffffffffffffd90);
    local_188 = local_188 + 0x10;
  } while (local_188 != local_38);
  Imath_3_2::Vec2<int>::Vec2(local_b0,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_b8,1,0x11);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,&in_stack_fffffffffffffd90->min);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Imath_3_2::Vec2<int>::Vec2(local_d0,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_d8,5,0x11);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,&in_stack_fffffffffffffd90->min);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Imath_3_2::Vec2<int>::Vec2(local_f0,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_f8,0x11,1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,&in_stack_fffffffffffffd90->min);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Imath_3_2::Vec2<int>::Vec2(local_110,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_118,0x11,5);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,&in_stack_fffffffffffffd90->min);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Imath_3_2::Vec2<int>::Vec2(local_130,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_138,1,1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,&in_stack_fffffffffffffd90->min);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Imath_3_2::Vec2<int>::Vec2(local_150,-0x12,-0x1c);
  Imath_3_2::Vec2<int>::Vec2(&local_158,0xf7,0xff);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,&in_stack_fffffffffffffd90->min);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  bVar1 = IlmThread_3_4::supportsThreads();
  iVar2 = 0;
  if ((bVar1 & 1) != 0) {
    iVar2 = 3;
  }
  for (local_160 = 0; local_160 <= iVar2; local_160 = local_160 + 1) {
    bVar1 = IlmThread_3_4::supportsThreads();
    if ((bVar1 & 1) != 0) {
      Imf_3_4::setGlobalThreadCount(local_160);
      poVar4 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      iVar3 = Imf_3_4::globalThreadCount();
      this = (void *)std::ostream::operator<<(poVar4,iVar3);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    for (local_164 = 0; local_164 < 6; local_164 = local_164 + 1) {
      for (local_168 = 0; local_168 < 2; local_168 = local_168 + 1) {
        for (local_16c = 0; local_16c < 3; local_16c = local_16c + 1) {
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_25c9c3::writeReadYca
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_25c9c3::writeReadYca
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_25c9c3::writeReadYca
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
          std::__cxx11::string::c_str();
          anon_unknown.dwarf_25c9c3::writeReadYca
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
        }
      }
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
testYca (const std::string& tempDir)
{
    try
    {
        cout << "Testing luminance/chroma input and output" << endl;

        std::string fileName = tempDir + "imf_test_yca.exr";

        Box2i dataWindow[6];
        dataWindow[0] = Box2i (V2i (0, 0), V2i (1, 17));
        dataWindow[1] = Box2i (V2i (0, 0), V2i (5, 17));
        dataWindow[2] = Box2i (V2i (0, 0), V2i (17, 1));
        dataWindow[3] = Box2i (V2i (0, 0), V2i (17, 5));
        dataWindow[4] = Box2i (V2i (0, 0), V2i (1, 1));
        dataWindow[5] = Box2i (V2i (-18, -28), V2i (247, 255));

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            for (int i = 0; i < 6; ++i)
            {
                for (int writeOrder = INCREASING_Y; writeOrder <= DECREASING_Y;
                     ++writeOrder)
                {
                    for (int readOrder = INCREASING_Y; readOrder <= RANDOM_Y;
                         ++readOrder)
                    {
                        writeReadYca (
                            fileName.c_str (),
                            dataWindow[i],
                            WRITE_YCA,
                            LineOrder (writeOrder),
                            LineOrder (readOrder),
                            fillPixelsColor);

                        writeReadYca (
                            fileName.c_str (),
                            dataWindow[i],
                            WRITE_YC,
                            LineOrder (writeOrder),
                            LineOrder (readOrder),
                            fillPixelsColor);

                        writeReadYca (
                            fileName.c_str (),
                            dataWindow[i],
                            WRITE_YA,
                            LineOrder (writeOrder),
                            LineOrder (readOrder),
                            fillPixelsGray);

                        writeReadYca (
                            fileName.c_str (),
                            dataWindow[i],
                            WRITE_Y,
                            LineOrder (writeOrder),
                            LineOrder (readOrder),
                            fillPixelsGray);
                    }
                }
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}